

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void binary(ch_compilation *comp)

{
  ch_token_kind cVar1;
  ch_op op;
  undefined1 local_14 [4];
  
  cVar1 = (comp->previous).kind;
  parse(comp,rules[cVar1].prec + PREC_ASSIGNMENT);
  switch(cVar1) {
  case TK_PLUS:
    break;
  default:
    goto switchD_00102a67_caseD_5;
  case TK_MINUS:
    break;
  case TK_STAR:
    break;
  case TK_FSLASH:
  }
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,local_14,1);
switchD_00102a67_caseD_5:
  return;
}

Assistant:

void binary(ch_compilation *comp) {
  ch_token_kind kind = comp->previous.kind;

  ch_precedence_level prec = get_rule(kind)->prec;
  parse(comp, (ch_precedence_level)(prec + 1));

  switch (kind) {
  case TK_PLUS:
    EMIT_OP(GET_EMIT(comp), OP_ADD);
    break;
  case TK_MINUS:
    EMIT_OP(GET_EMIT(comp), OP_SUB);
    break;
  case TK_STAR:
    EMIT_OP(GET_EMIT(comp), OP_MUL);
    break;
  case TK_FSLASH:
    EMIT_OP(GET_EMIT(comp), OP_DIV);
    break;
  default:
    return;
  }
}